

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  RPlidarDriver *pRVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  uint32_t in_R9D;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  rplidar_response_measurement_node_hq_t arStack_7118 [359];
  undefined8 uStack_65e0;
  rplidar_response_measurement_node_hq_t local_65d8;
  rplidar_response_measurement_node_hq_t nodes [2880];
  undefined1 local_bd0 [8];
  LaserScan scan;
  rplidar_response_device_info_t devinfo;
  undefined1 local_58 [8];
  timeval tv;
  long local_38;
  size_t count;
  
  uStack_65e0 = 0x104af2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"progress begins ...",0x13);
  uStack_65e0 = 0x104b06;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  uStack_65e0 = 0x104b11;
  std::ostream::put('h');
  uStack_65e0 = 0x104b19;
  std::ostream::flush();
  uStack_65e0 = 0x104b20;
  pRVar3 = (RPlidarDriver *)rp::standalone::rplidar::RPlidarDriver::CreateDriver(0);
  if (pRVar3 == (RPlidarDriver *)0x0) {
    uStack_65e0 = 0x104ee8;
    main_cold_1();
    return 0;
  }
  uStack_65e0 = 0x104b42;
  iVar1 = (*(code *)**(undefined8 **)pRVar3)(pRVar3,"/dev/ttyUSB1",0x1c200,0);
  if (iVar1 < 0) {
    pcVar8 = "connected failed ...";
    lVar6 = 0x14;
  }
  else {
    uStack_65e0 = 0x104b59;
    iVar1 = (**(code **)(*(long *)pRVar3 + 0x50))(pRVar3,scan.intensities + 0x166,2000);
    if (iVar1 < 0) {
      uStack_65e0 = 0x104bbc;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"get device information failed",0x1d);
      uStack_65e0 = 0x104bd0;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      uStack_65e0 = 0x104bdb;
      std::ostream::put('h');
      uStack_65e0 = 0x104be3;
      std::ostream::flush();
      uStack_65e0 = 0x104bf0;
      (**(code **)(*(long *)pRVar3 + 0xe0))(pRVar3);
      pRVar3 = (RPlidarDriver *)0x0;
      goto LAB_00104bf3;
    }
    pcVar8 = "connected successfully ...";
    lVar6 = 0x1a;
  }
  uStack_65e0 = 0x104b7f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar6);
  uStack_65e0 = 0x104b93;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  uStack_65e0 = 0x104b9e;
  std::ostream::put('h');
  uStack_65e0 = 0x104ba6;
  std::ostream::flush();
LAB_00104bf3:
  uStack_65e0 = 0x104bfd;
  (**(code **)(*(long *)pRVar3 + 0x68))(pRVar3);
  iVar1 = 0;
  uStack_65e0 = 0x104c1b;
  (**(code **)(*(long *)pRVar3 + 0x38))(pRVar3,0,1,0,0);
  lVar6 = 0;
  tv.tv_usec = (__suseconds_t)pRVar3;
LAB_00104c2d:
  do {
    local_38 = 0xb40;
    uStack_65e0 = 0x104c4d;
    iVar2 = (**(code **)(*(long *)pRVar3 + 0xb0))(pRVar3,&local_65d8,&local_38,2000);
    if (iVar2 == 0) {
      if (iVar1 == 0) {
        uStack_65e0 = 0x104d33;
        gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
        lVar6 = tv.tv_sec / 1000 + (long)local_58 * 1000;
        iVar1 = 1;
        goto LAB_00104c2d;
      }
      iVar1 = iVar1 + 1;
      uStack_65e0 = 0x104c76;
      gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
      lVar5 = (long)local_58 * 1000;
      lVar10 = tv.tv_sec / 1000 + lVar5;
      lVar9 = lVar10 - lVar6;
      uStack_65e0 = 0x104cc4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"delta_time = ",0xd);
      uStack_65e0 = 0x104cd3;
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      uStack_65e0 = 0x104cea;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      uStack_65e0 = 0x104cf5;
      std::ostream::put((char)poVar4);
      uStack_65e0 = 0x104cfd;
      std::ostream::flush();
      uStack_65e0 = 0x104d14;
      iVar2 = (**(code **)(*(long *)pRVar3 + 0xc0))(pRVar3,&local_65d8,local_38);
      pRVar3 = (RPlidarDriver *)tv.tv_usec;
      lVar6 = lVar10;
      if (iVar2 == 0) {
        uStack_65e0 = 0x104d7f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"in here ...",0xb);
        uStack_65e0 = 0x104d93;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        uStack_65e0 = 0x104d9e;
        std::ostream::put('h');
        uStack_65e0 = 0x104da6;
        std::ostream::flush();
        memset(arStack_7118,0,0xb40);
        if (local_38 != 0) {
          lVar5 = 0;
          iVar2 = 0;
          do {
            if (nodes[lVar5 + -1].dist_mm_q2 != 0) {
              fVar12 = (float)nodes[lVar5 + -1].angle_z_q14 * 90.0 * 6.1035156e-05;
              fVar11 = (float)(int)fVar12;
              if (fVar11 < (float)iVar2) {
                iVar2 = (int)fVar12;
              }
              iVar7 = (int)(fVar11 - (float)iVar2);
              if (0x166 < iVar7) {
                iVar7 = 0x167;
              }
              arStack_7118[iVar7] = nodes[lVar5 + -1];
            }
            lVar5 = lVar5 + 1;
          } while (local_38 != lVar5);
        }
        publish_scan(arStack_7118,(LaserScan *)local_bd0,0x168,(uint32_t)lVar5,(double)lVar9 * 0.001
                     ,false,0.0,6.265732,8.0,in_R9D);
        pRVar3 = (RPlidarDriver *)tv.tv_usec;
      }
    }
    if (ctrl_c_pressed == true) {
      uStack_65e0 = 0x104ec0;
      (**(code **)(*(long *)pRVar3 + 0xa0))(pRVar3,2000);
      uStack_65e0 = 0x104eca;
      (**(code **)(*(long *)pRVar3 + 0x70))(pRVar3);
      uStack_65e0 = 0x104ed2;
      rp::standalone::rplidar::RPlidarDriver::DisposeDriver(pRVar3);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	std::cout<<"progress begins ..."<<std::endl;

	slam::sensor::LaserScan scan;

	long previous_time = 0;
	long current_time = 0;
	long delta_time = 0;

	const char * opt_com_path = "/dev/ttyUSB1";
	_u32 opt_com_baudrate = 115200;
	u_result op_result;
	
	bool angle_compensate = true;
	int angle_compensate_multiple = 1;
	bool inverted = false;	

	// create the driver instance
        RPlidarDriver * drv = RPlidarDriver::CreateDriver(DRIVER_TYPE_SERIALPORT);

	if (!drv) {
        	fprintf(stderr, "insufficent memory, exit\n");
        	return false;
    	}
	
	rplidar_response_device_info_t devinfo;
	if (IS_OK(drv->connect(opt_com_path, opt_com_baudrate)))
        {
            op_result = drv->getDeviceInfo(devinfo);

            if (IS_OK(op_result))
            {   
              	std::cout<<"connected successfully ..."<<std::endl;
            }
            else
            {
		std::cout<<"get device information failed"<<std::endl;
                delete drv;
                drv = NULL;
            }
        }
	else{
		std::cout<<"connected failed ..."<<std::endl;
	}

	drv->startMotor();
	drv->startScan( 0, 1 );
	
	uint32_t scan_num  = 0;
	while(1){
		rplidar_response_measurement_node_hq_t nodes[360 * 8];
		size_t   count = _countof(nodes);
		op_result = drv->grabScanDataHq( nodes, count );
		
		if( op_result == RESULT_OK ){
			scan_num ++;
			if( scan_num == 1 ){
				current_time = previous_time = getCurrentTime_ms();
				continue;
			}
			current_time = getCurrentTime_ms();
			delta_time = current_time - previous_time;
			std::cout<<"delta_time = "<<delta_time<<std::endl;
			op_result = drv->ascendScanData( nodes, count );
			float angle_min = DEG2RAD( 0.0f );
			float angle_max = DEG2RAD( 359.0f );
			if( op_result == RESULT_OK ){
				if( angle_compensate ){
					std::cout<<"in here ..."<<std::endl;
					const int angle_compensate_nodes_count = 360 * angle_compensate_multiple;
					int angle_compensate_offset = 0;
					rplidar_response_measurement_node_hq_t angle_compensate_nodes[ angle_compensate_nodes_count ];
					memset( angle_compensate_nodes, 0, angle_compensate_nodes_count * sizeof( rplidar_response_measurement_node_hq_t ) );
					
					for( int i = 0; i < count; i ++ ){
						if( nodes[i].dist_mm_q2 != 0 ){
							float angle = getAngle( nodes[i] );
							float angle_value = (int)( angle * angle_compensate_multiple );
							if( ( angle_value - angle_compensate_offset ) < 0 ) angle_compensate_offset = angle_value;
							for( int j = 0; j < angle_compensate_multiple; j ++ ){
								int angle_compensate_nodes_index = angle_value - angle_compensate_offset + j ;
								if( angle_compensate_nodes_index >= angle_compensate_nodes_count )
									angle_compensate_nodes_index = angle_compensate_nodes_count - 1 ;
								angle_compensate_nodes[angle_compensate_nodes_index] = nodes[i];
							}
						}
					}
					
					publish_scan( angle_compensate_nodes, scan, angle_compensate_nodes_count, \
						        current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
				else{
					int start_node = 0, end_node = 0;
					int i = 0;	
					while( nodes[i++].dist_mm_q2 == 0 );
					start_node = i - 1;
					i = count - 1;
					while( nodes[i--].dist_mm_q2 == 0 );
					end_node = i + 1;

					angle_min = DEG2RAD( getAngle( nodes[start_node] ) );
					angle_max = DEG2RAD( getAngle( nodes[end_node] ) );

					publish_scan( nodes, scan, count, current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
			}
			else if( op_result == RESULT_OPERATION_FAIL ){
				float angle_min = DEG2RAD( 0.0f );
				float angle_max = DEG2RAD( 359.0f );
				//publish_scan(  );
			}

			previous_time = current_time;
		}
		
		if( ctrl_c_pressed ){
			break;
		}
        }
	
	drv->stop();
	drv->stopMotor();
	RPlidarDriver::DisposeDriver(drv);
    	drv = NULL;

	
	return 0;
}